

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O3

HashMap<String,_Variant> * __thiscall Variant::toMap(Variant *this)

{
  Data *pDVar1;
  HashMap<String,_Variant> *other;
  HashMap<String,_Variant> *this_00;
  
  pDVar1 = this->data;
  if ((pDVar1->type == mapType) && (pDVar1->ref < 2)) {
    this_00 = (HashMap<String,_Variant> *)(pDVar1 + 1);
  }
  else {
    pDVar1 = (Data *)operator_new__(0xb8);
    this_00 = (HashMap<String,_Variant> *)(pDVar1 + 1);
    other = toMap(this);
    HashMap<String,_Variant>::HashMap(this_00,other);
    clear(this);
    this->data = pDVar1;
    pDVar1->type = mapType;
    pDVar1->ref = 1;
  }
  return this_00;
}

Assistant:

HashMap<String, Variant>& toMap()
  {
    if(data->type != mapType || data->ref > 1)
    {
      Data* newData = (Data*)new char[sizeof(Data) + sizeof(HashMap<String, Variant>)];
      HashMap<String, Variant>* map = (HashMap<String, Variant>*)(newData + 1);
      new (map) HashMap<String, Variant>(((const Variant*)this)->toMap());
      clear();
      data = newData;
      data->type = mapType;
      data->ref = 1;
      return *map;
    }
    return *(HashMap<String, Variant>*)(data + 1);
  }